

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
          (SmallVectorBase<std::filesystem::__cxx11::path> *this,EVP_PKEY_CTX *ctx)

{
  std::ranges::__destroy_fn::operator()<slang::SmallVectorBase<std::filesystem::__cxx11::path>_&>
            ((__destroy_fn *)&std::ranges::destroy,this);
  if (this->data_ != (pointer)this->firstElement) {
    operator_delete(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }